

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O1

void __thiscall CVmRun::set_funchdr_size(CVmRun *this,size_t siz)

{
  this->funchdr_size_ = siz;
  if (9 < siz) {
    return;
  }
  err_throw_a(0x141,1,8);
}

Assistant:

void CVmRun::set_funchdr_size(size_t siz)
{
    /* remember the new size */
    funchdr_size_ = siz;

    /* 
     *   Ensure that the size is at least as large as our required function
     *   header block - if it's not, this version of the VM can't run this
     *   image file.  If we throw an error, flag it as a version mismatch
     *   error.  
     */
    if (siz < VMFUNC_HDR_MIN_SIZE)
        err_throw_a(VMERR_IMAGE_INCOMPAT_HDR_FMT, 1, ERR_TYPE_VERSION_FLAG);
}